

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

wchar_t spell_collect_from_book(player *p,object *obj,int **spells)

{
  long lVar1;
  int *piVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  class_book *pcVar5;
  
  lVar1 = (long)(p->class->magic).num_books;
  uVar4 = 0;
  if (0 < lVar1) {
    pcVar5 = (p->class->magic).books;
    do {
      if ((pcVar5->tval == (uint)obj->tval) && (pcVar5->sval == (uint)obj->sval)) goto LAB_001a8c3f;
      pcVar5 = pcVar5 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  pcVar5 = (class_book *)0x0;
LAB_001a8c3f:
  if (pcVar5 != (class_book *)0x0) {
    uVar4 = 0;
    if (L'\0' < pcVar5->num_spells) {
      uVar4 = (ulong)(uint)pcVar5->num_spells;
    }
    piVar2 = (int *)mem_zalloc(uVar4 * 8);
    *spells = piVar2;
    if (L'\0' < pcVar5->num_spells) {
      pwVar3 = &pcVar5->spells->sidx;
      lVar1 = 0;
      do {
        piVar2[lVar1] = *pwVar3;
        lVar1 = lVar1 + 1;
        pwVar3 = pwVar3 + 0xe;
      } while (lVar1 < pcVar5->num_spells);
    }
  }
  return (wchar_t)uVar4;
}

Assistant:

int spell_collect_from_book(const struct player *p, const struct object *obj,
		int **spells)
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	/* Count the spells */
	for (i = 0; i < book->num_spells; i++)
		n_spells++;

	/* Allocate the array */
	*spells = mem_zalloc(n_spells * sizeof(*spells));

	/* Write the spells */
	for (i = 0; i < book->num_spells; i++)
		(*spells)[i] = book->spells[i].sidx;

	return n_spells;
}